

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv_mu_timeout_stress_test.c
# Opt level: O2

int run_stress_test(cv_stress_data *s,testing t,char *test_name)

{
  ulong uVar1;
  int iVar2;
  closure *pcVar3;
  char *pcVar4;
  closure_t_mu_stress_inc_loop_2 in_RCX;
  closure_t_mu_stress_inc_loop_2 a2;
  closure_t_cv_stress_inc_loop_1 a1;
  closure_t_cv_stress_inc_loop_1 a1_00;
  closure_t_cv_stress_inc_loop_1 a1_01;
  closure_t_cv_stress_reader_loop_1 a1_02;
  closure_t_cv_stress_reader_loop_1 a1_03;
  closure_t_cv_stress_reader_loop_1 a1_04;
  closure_t_cv_stress_inc_loop_1 a1_05;
  closure_t_cv_stress_reader_loop_1 a1_06;
  int iVar5;
  ulong uVar6;
  uintmax_t uVar7;
  uintmax_t uVar8;
  nsync_time nVar9;
  nsync_time nVar10;
  
  nsync::nsync_mu_lock(&s->mu);
  nsync::nsync_mu_assert_held(&s->mu);
  for (uVar7 = 0; uVar7 != s->cv_threads_per_value; uVar7 = uVar7 + 1) {
    nsync::nsync_mu_assert_held(&s->mu);
    s->refs = s->refs + 1;
    pcVar3 = closure_cv_stress_inc_loop
                       ((_func_void_closure_t_cv_stress_inc_loop_0_closure_t_cv_stress_inc_loop_1 *)
                        s,(closure_t_cv_stress_inc_loop_0)&DAT_00000001,a1);
    closure_fork(pcVar3);
    s->refs = s->refs + 1;
    pcVar3 = closure_cv_stress_inc_loop
                       ((_func_void_closure_t_cv_stress_inc_loop_0_closure_t_cv_stress_inc_loop_1 *)
                        s,(closure_t_cv_stress_inc_loop_0)&DAT_00000002,a1_00);
    closure_fork(pcVar3);
    s->refs = s->refs + 1;
    pcVar3 = closure_cv_stress_inc_loop
                       ((_func_void_closure_t_cv_stress_inc_loop_0_closure_t_cv_stress_inc_loop_1 *)
                        s,(closure_t_cv_stress_inc_loop_0)&DAT_00000003,a1_01);
    closure_fork(pcVar3);
  }
  for (uVar7 = 0; uVar7 != s->cv_reader_threads_per_value; uVar7 = uVar7 + 1) {
    nsync::nsync_mu_assert_held(&s->mu);
    s->reader_refs = s->reader_refs + 1;
    pcVar3 = closure_cv_stress_reader_loop
                       ((_func_void_closure_t_cv_stress_reader_loop_0_closure_t_cv_stress_reader_loop_1
                         *)s,(closure_t_cv_stress_reader_loop_0)&DAT_00000001,a1_02);
    closure_fork(pcVar3);
    s->reader_refs = s->reader_refs + 1;
    pcVar3 = closure_cv_stress_reader_loop
                       ((_func_void_closure_t_cv_stress_reader_loop_0_closure_t_cv_stress_reader_loop_1
                         *)s,(closure_t_cv_stress_reader_loop_0)&DAT_00000002,a1_03);
    closure_fork(pcVar3);
    s->reader_refs = s->reader_refs + 1;
    pcVar3 = closure_cv_stress_reader_loop
                       ((_func_void_closure_t_cv_stress_reader_loop_0_closure_t_cv_stress_reader_loop_1
                         *)s,(closure_t_cv_stress_reader_loop_0)&DAT_00000003,a1_04);
    closure_fork(pcVar3);
  }
  for (uVar7 = 0; uVar7 != s->mu_threads_per_value; uVar7 = uVar7 + 1) {
    nsync::nsync_mu_assert_held(&s->mu);
    s->refs = s->refs + 1;
    pcVar3 = closure_mu_stress_inc_loop
                       ((_func_void_closure_t_mu_stress_inc_loop_0_closure_t_mu_stress_inc_loop_1_closure_t_mu_stress_inc_loop_2
                         *)s,(closure_t_mu_stress_inc_loop_0)count_is1mod4,
                        (closure_t_mu_stress_inc_loop_1)s,in_RCX);
    closure_fork(pcVar3);
    s->refs = s->refs + 1;
    pcVar3 = closure_mu_stress_inc_loop
                       ((_func_void_closure_t_mu_stress_inc_loop_0_closure_t_mu_stress_inc_loop_1_closure_t_mu_stress_inc_loop_2
                         *)s,(closure_t_mu_stress_inc_loop_0)count_is2mod4,
                        (closure_t_mu_stress_inc_loop_1)s,in_RCX);
    closure_fork(pcVar3);
    s->refs = s->refs + 1;
    pcVar3 = closure_mu_stress_inc_loop
                       ((_func_void_closure_t_mu_stress_inc_loop_0_closure_t_mu_stress_inc_loop_1_closure_t_mu_stress_inc_loop_2
                         *)s,(closure_t_mu_stress_inc_loop_0)count_is3mod4,
                        (closure_t_mu_stress_inc_loop_1)s,in_RCX);
    closure_fork(pcVar3);
  }
  uVar7 = 0;
  while( true ) {
    uVar8 = s->mu_reader_threads_per_value;
    nsync::nsync_mu_assert_held(&s->mu);
    if (uVar7 == uVar8) break;
    s->reader_refs = s->reader_refs + 1;
    pcVar3 = closure_mu_stress_reader_loop
                       ((_func_void_closure_t_mu_stress_reader_loop_0_closure_t_mu_stress_reader_loop_1_closure_t_mu_stress_reader_loop_2
                         *)s,(closure_t_mu_stress_reader_loop_0)count_is1mod4or_refs_is0,
                        (closure_t_mu_stress_reader_loop_1)s,in_RCX);
    closure_fork(pcVar3);
    s->reader_refs = s->reader_refs + 1;
    pcVar3 = closure_mu_stress_reader_loop
                       ((_func_void_closure_t_mu_stress_reader_loop_0_closure_t_mu_stress_reader_loop_1_closure_t_mu_stress_reader_loop_2
                         *)s,(closure_t_mu_stress_reader_loop_0)count_is2mod4or_refs_is0,
                        (closure_t_mu_stress_reader_loop_1)s,in_RCX);
    closure_fork(pcVar3);
    s->reader_refs = s->reader_refs + 1;
    pcVar3 = closure_mu_stress_reader_loop
                       ((_func_void_closure_t_mu_stress_reader_loop_0_closure_t_mu_stress_reader_loop_1_closure_t_mu_stress_reader_loop_2
                         *)s,(closure_t_mu_stress_reader_loop_0)count_is3mod4or_refs_is0,
                        (closure_t_mu_stress_reader_loop_1)s,in_RCX);
    closure_fork(pcVar3);
    uVar7 = uVar7 + 1;
  }
  nsync::nsync_mu_unlock(&s->mu);
  nVar9 = nsync::nsync_time_ms(1000);
  nVar10.tv_nsec = nVar9.tv_nsec;
  nVar10.tv_sec = nVar10.tv_nsec;
  nsync::nsync_time_sleep((nsync *)nVar9.tv_sec,nVar10);
  nsync::nsync_mu_lock(&s->mu);
  nsync::nsync_mu_assert_held(&s->mu);
  uVar1 = s->timeouts;
  uVar7 = s->cv_threads_per_value;
  a2 = (closure_t_mu_stress_inc_loop_2)(s->mu_threads_per_value + uVar7);
  uVar6 = (long)a2 * 0x5dc;
  for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    nsync::nsync_mu_assert_held(&s->mu);
    s->refs = s->refs + 1;
    pcVar3 = closure_cv_stress_inc_loop
                       ((_func_void_closure_t_cv_stress_inc_loop_0_closure_t_cv_stress_inc_loop_1 *)
                        s,(closure_t_cv_stress_inc_loop_0)0x0,a1_05);
    closure_fork(pcVar3);
    uVar7 = s->cv_threads_per_value;
  }
  for (uVar7 = 0; uVar7 != s->cv_reader_threads_per_value; uVar7 = uVar7 + 1) {
    nsync::nsync_mu_assert_held(&s->mu);
    s->reader_refs = s->reader_refs + 1;
    pcVar3 = closure_cv_stress_reader_loop
                       ((_func_void_closure_t_cv_stress_reader_loop_0_closure_t_cv_stress_reader_loop_1
                         *)s,(closure_t_cv_stress_reader_loop_0)0x0,a1_06);
    closure_fork(pcVar3);
  }
  for (uVar7 = 0; uVar7 != s->mu_threads_per_value; uVar7 = uVar7 + 1) {
    nsync::nsync_mu_assert_held(&s->mu);
    s->refs = s->refs + 1;
    pcVar3 = closure_mu_stress_inc_loop
                       ((_func_void_closure_t_mu_stress_inc_loop_0_closure_t_mu_stress_inc_loop_1_closure_t_mu_stress_inc_loop_2
                         *)s,(closure_t_mu_stress_inc_loop_0)count_is0mod4,
                        (closure_t_mu_stress_inc_loop_1)s,a2);
    closure_fork(pcVar3);
  }
  uVar7 = 0;
  while( true ) {
    uVar8 = s->mu_reader_threads_per_value;
    nsync::nsync_mu_assert_held(&s->mu);
    if (uVar7 == uVar8) break;
    s->reader_refs = s->reader_refs + 1;
    pcVar3 = closure_mu_stress_reader_loop
                       ((_func_void_closure_t_mu_stress_reader_loop_0_closure_t_mu_stress_reader_loop_1_closure_t_mu_stress_reader_loop_2
                         *)s,(closure_t_mu_stress_reader_loop_0)count_is0mod4or_refs_is0,
                        (closure_t_mu_stress_reader_loop_1)s,a2);
    closure_fork(pcVar3);
    uVar7 = uVar7 + 1;
  }
  while (s->refs != 0) {
    nsync::nsync_cv_wait(&s->refs_is_zero,&s->mu);
  }
  while (s->reader_refs != 0) {
    nsync::nsync_cv_wait(&s->reader_refs_is_zero,&s->mu);
  }
  nsync::nsync_mu_assert_held(&s->mu);
  nsync::nsync_mu_unlock(&s->mu);
  nVar9 = s->deadline;
  nVar10 = nsync::nsync_time_now();
  iVar2 = nsync::nsync_time_cmp(nVar9,nVar10);
  iVar5 = 0;
  if (iVar2 < 0) {
    uVar6 = uVar6 >> 3;
    if (uVar1 < uVar6) {
      iVar2 = testing_is_uniprocessor(t);
      if (iVar2 == 0) {
        pcVar4 = smprintf("%s: expected more than %d timeouts, got %d",test_name,uVar6,uVar1);
        testing_error_(t,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/cv_mu_timeout_stress_test.c"
                       ,0x1d3,pcVar4);
      }
    }
    if (s->count != (s->mu_threads_per_value + s->cv_threads_per_value) * s->loop_count * 4) {
      pcVar4 = smprintf("%s: expected to increment s->count to %d, got %d",test_name);
      testing_error_(t,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/cv_mu_timeout_stress_test.c"
                     ,0x1db,pcVar4);
    }
    if (s->timeouts < uVar1 + 1) {
      pcVar4 = smprintf("%s: expected more than %d timeouts, got %d",test_name,uVar1 + 1);
      iVar5 = 1;
      testing_error_(t,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/cv_mu_timeout_stress_test.c"
                     ,0x1e2,pcVar4);
    }
    else {
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

static int run_stress_test (cv_stress_data *s, testing t,
			    const char *test_name) {
	int done = 0;
	uintmax_t expected_timeouts;
	uintmax_t timeouts_seen;
	uintmax_t expected_count;
	uintmax_t i;
	static const int sleep_seconds = 1;

	nsync_mu_lock (&s->mu);
	nsync_mu_assert_held (&s->mu);
	/* Create threads trying to increment from 1, 2, and 3 mod 4.
	   They will continually hit their timeouts because s.count==0 */
	for (i = 0; i != s->cv_threads_per_value; i++) {
		nsync_mu_assert_held (&s->mu);
		s->refs++;
		closure_fork (closure_cv_stress_inc_loop (&cv_stress_inc_loop, s, 1));
		s->refs++;
		closure_fork (closure_cv_stress_inc_loop (&cv_stress_inc_loop, s, 2));
		s->refs++;
		closure_fork (closure_cv_stress_inc_loop (&cv_stress_inc_loop, s, 3));
	}
	for (i = 0; i != s->cv_reader_threads_per_value; i++) {
		nsync_mu_assert_held (&s->mu);
		s->reader_refs++;
		closure_fork (closure_cv_stress_reader_loop (&cv_stress_reader_loop, s, 1));
		s->reader_refs++;
		closure_fork (closure_cv_stress_reader_loop (&cv_stress_reader_loop, s, 2));
		s->reader_refs++;
		closure_fork (closure_cv_stress_reader_loop (&cv_stress_reader_loop, s, 3));
	}
	for (i = 0; i != s->mu_threads_per_value; i++) {
		nsync_mu_assert_held (&s->mu);
		s->refs++;
		closure_fork (closure_mu_stress_inc_loop (&mu_stress_inc_loop,
							  s, is_n_mod_4[1], s));
		s->refs++;
		closure_fork (closure_mu_stress_inc_loop (&mu_stress_inc_loop,
							  s, is_n_mod_4[2], s));
		s->refs++;
		closure_fork (closure_mu_stress_inc_loop (&mu_stress_inc_loop,
							  s, is_n_mod_4[3], s));
	}
	for (i = 0; i != s->mu_reader_threads_per_value; i++) {
		nsync_mu_assert_held (&s->mu);
		s->reader_refs++;
		closure_fork (closure_mu_stress_reader_loop (&mu_stress_reader_loop,
							     s, is_n_mod_4_or_refs0[1], s));
		s->reader_refs++;
		closure_fork (closure_mu_stress_reader_loop (&mu_stress_reader_loop,
							     s, is_n_mod_4_or_refs0[2], s));
		s->reader_refs++;
		closure_fork (closure_mu_stress_reader_loop (&mu_stress_reader_loop,
							     s, is_n_mod_4_or_refs0[3], s));
	}
	nsync_mu_assert_held (&s->mu);
	nsync_mu_unlock (&s->mu);

	/* Sleep a while to cause many timeouts. */
	nsync_time_sleep (nsync_time_ms (sleep_seconds * 1000));

	nsync_mu_lock (&s->mu);
	nsync_mu_assert_held (&s->mu);

	/* Check that approximately the right number of timeouts have occurred.
	   The 3 below is the three classes of thread produced before the Sleep().
	   The factor of 1/8 is to allow for randomness and slow test machines. */
	expected_timeouts = (s->cv_threads_per_value + s->mu_threads_per_value) * 3 *
			     sleep_seconds * STRESS_EXPECT_TIMEOUTS_PER_SEC / 8;
	timeouts_seen = s->timeouts;
	/* actual check is below. */

	/* Create the threads that increment from 0 mod 4.   s.count will then be incremented. */
	for (i = 0; i != s->cv_threads_per_value; i++) {
		nsync_mu_assert_held (&s->mu);
		s->refs++;
		closure_fork (closure_cv_stress_inc_loop (&cv_stress_inc_loop, s, 0));
	}
	for (i = 0; i != s->cv_reader_threads_per_value; i++) {
		nsync_mu_assert_held (&s->mu);
		s->reader_refs++;
		closure_fork (closure_cv_stress_reader_loop (&cv_stress_reader_loop, s, 0));
	}
	for (i = 0; i != s->mu_threads_per_value; i++) {
		nsync_mu_assert_held (&s->mu);
		s->refs++;
		closure_fork (closure_mu_stress_inc_loop (&mu_stress_inc_loop,
							  s, is_n_mod_4[0], s));
	}
	for (i = 0; i != s->mu_reader_threads_per_value; i++) {
		nsync_mu_assert_held (&s->mu);
		s->reader_refs++;
		closure_fork (closure_mu_stress_reader_loop (&mu_stress_reader_loop,
							     s, is_n_mod_4_or_refs0[0], s));
	}

	/* wait for threads to exit. */
	nsync_mu_assert_held (&s->mu);
	while (s->refs != 0) {
		nsync_cv_wait (&s->refs_is_zero, &s->mu);
	}
	while (s->reader_refs != 0) {
		nsync_cv_wait (&s->reader_refs_is_zero, &s->mu);
	}

	nsync_mu_assert_held (&s->mu);
	nsync_mu_unlock (&s->mu);

	if (nsync_time_cmp (s->deadline, nsync_time_now ()) < 0) {
		if (timeouts_seen < expected_timeouts && !testing_is_uniprocessor (t)) {
			TEST_ERROR (t, ("%s: expected more than %d timeouts, got %d",
				   test_name, expected_timeouts, timeouts_seen));
		}

		/* Check that s.count has the right value. */
		expected_count = s->loop_count * (s->cv_threads_per_value +
						  s->mu_threads_per_value) * 4;
		if (s->count != expected_count) {
			TEST_ERROR (t, ("%s: expected to increment s->count to %d, got %d",
				   test_name, expected_count, s->count));
		}

		/* Some timeouts should have happened while the counts were being incremented. */
		expected_timeouts = timeouts_seen + 1;
		if (s->timeouts < expected_timeouts) {
			TEST_ERROR (t, ("%s: expected more than %d timeouts, got %d",
				   test_name, expected_timeouts, s->timeouts));
		}
		done = 1;
	}
	return (done);
}